

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O0

string * adios2::helper::GetFQDN_abi_cxx11_(void)

{
  int iVar1;
  char *pcVar2;
  string *in_RDI;
  addrinfo *p;
  addrinfo *info;
  addrinfo hints;
  char hostname [1024];
  allocator local_449;
  addrinfo *local_448;
  addrinfo *local_440;
  addrinfo local_438;
  char local_408 [1023];
  undefined1 local_9;
  
  local_9 = 0;
  gethostname(local_408,0x3ff);
  local_438.ai_canonname = (char *)0x0;
  local_438.ai_next = (addrinfo *)0x0;
  local_438.ai_addrlen = 0;
  local_438._20_4_ = 0;
  local_438.ai_addr = (sockaddr *)0x0;
  local_438.ai_socktype = 1;
  local_438.ai_protocol = 0;
  local_438.ai_flags = 2;
  local_438.ai_family = 0;
  iVar1 = getaddrinfo(local_408,(char *)0x0,&local_438,&local_440);
  if (iVar1 == 0) {
    for (local_448 = local_440; local_448 != (addrinfo *)0x0; local_448 = local_448->ai_next) {
      pcVar2 = strchr(local_448->ai_canonname,0x2e);
      if (pcVar2 != (char *)0x0) {
        strncpy(local_408,local_448->ai_canonname,0x3ff);
        break;
      }
    }
  }
  else {
    strcpy(local_408,"Unknown_Host_Name");
  }
  freeaddrinfo(local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_408,&local_449);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  return in_RDI;
}

Assistant:

std::string GetFQDN() noexcept
{
    char hostname[1024];
#ifdef WIN32
    TCHAR infoBuf[1024];
    DWORD bufCharCount = sizeof(hostname);
    memset(hostname, 0, sizeof(hostname));
    if (GetComputerName(infoBuf, &bufCharCount))
    {
        int i;
        for (i = 0; i < sizeof(hostname); i++)
        {
            hostname[i] = infoBuf[i];
        }
    }
    else
    {
        strcpy(hostname, "Unknown_Host_Name");
    }
#else
    struct addrinfo hints, *info, *p;

    hostname[1023] = '\0';
    gethostname(hostname, 1023);

    memset(&hints, 0, sizeof hints);
    hints.ai_family = AF_UNSPEC; /*either IPV4 or IPV6*/
    hints.ai_socktype = SOCK_STREAM;
    hints.ai_flags = AI_CANONNAME;

    if (getaddrinfo(hostname, NULL, &hints, &info) == 0)
    {
        for (p = info; p != NULL; p = p->ai_next)
        {
            // printf("hostname: %s\n", p->ai_canonname);
            if (strchr(p->ai_canonname, '.') != NULL)
            {
                strncpy(hostname, p->ai_canonname, sizeof(hostname) - 1);
                break;
            }
        }
    }
    else
    {
        strcpy(hostname, "Unknown_Host_Name");
    }
    freeaddrinfo(info);
#endif
    return std::string(hostname);
}